

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

int __thiscall bigint<13>::numbits(bigint<13> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar1 = this->len;
  iVar2 = 0;
  if ((long)iVar1 != 0) {
    iVar3 = iVar1 << 4;
    for (uVar4 = 0x8000;
        (iVar2 = 0, (ushort)uVar4 != 0 &&
        (iVar2 = iVar3, ((ushort)uVar4 & this->digits[(long)iVar1 + -1]) == 0)); uVar4 = uVar4 >> 1)
    {
      iVar3 = iVar3 + -1;
    }
  }
  return iVar2;
}

Assistant:

int numbits() const
    {
        if(!len) return 0;
        int bits = len*BI_DIGIT_BITS;
        digit last = digits[len-1], mask = 1<<(BI_DIGIT_BITS-1);
        while(mask)
        {
            if(last&mask) return bits;
            bits--;
            mask >>= 1;
        }
        return 0;
    }